

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O2

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::Check
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *object)

{
  Type TVar1;
  Type *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  RecyclableObject *prototype;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0x98,"(object)","object");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pTVar2 = (object->type).ptr;
  if ((pTVar2->flags & TypeFlagMask_HasSpecialPrototype) != TypeFlagMask_None) {
    TVar1 = pTVar2->typeId;
    if (TVar1 == TypeIds_Null) {
      return true;
    }
    if (TVar1 == TypeIds_Proxy) {
      return false;
    }
  }
  bVar4 = RecyclableObject::HasOnlyWritableDataProperties(object);
  if (!bVar4) {
    return false;
  }
  prototype = RecyclableObject::GetPrototype(object);
  bVar4 = CheckProtoChain(this,prototype);
  return bVar4;
}

Assistant:

bool
PrototypeChainCache<T>::Check(_In_ RecyclableObject* object)
{
    Assert(object);
    if (object->GetType()->HasSpecialPrototype())
    {
        TypeId typeId = object->GetTypeId();
        if (typeId == TypeIds_Null)
        {
            return true;
        }
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
    }

    if (!T::CheckObject(object))
    {
        return false;
    }

    return CheckProtoChain(object->GetPrototype());
}